

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t archive_read_format_tar_skip(archive_read *a)

{
  tar *tar;
  wchar_t wVar1;
  int64_t iVar2;
  
  tar = (tar *)a->format->data;
  iVar2 = __archive_read_consume
                    (a,tar->entry_padding + tar->entry_bytes_remaining + tar->entry_bytes_unconsumed
                    );
  if (iVar2 < 0) {
    wVar1 = L'\xffffffe2';
  }
  else {
    tar->entry_bytes_remaining = 0;
    tar->entry_padding = 0;
    tar->entry_bytes_unconsumed = 0;
    gnu_clear_sparse_list(tar);
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

static int
archive_read_format_tar_skip(struct archive_read *a)
{
	int64_t bytes_skipped;
	struct tar* tar;

	tar = (struct tar *)(a->format->data);

	bytes_skipped = __archive_read_consume(a,
	    tar->entry_bytes_remaining + tar->entry_padding +
	    tar->entry_bytes_unconsumed);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	tar->entry_bytes_remaining = 0;
	tar->entry_bytes_unconsumed = 0;
	tar->entry_padding = 0;

	/* Free the sparse list. */
	gnu_clear_sparse_list(tar);

	return (ARCHIVE_OK);
}